

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spell_corrector.cpp
# Opt level: O2

wstring * __thiscall
NJamSpell::TSpellCorrector::FixFragmentNormalized
          (wstring *__return_storage_ptr__,TSpellCorrector *this,wstring *text)

{
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *__lhs;
  undefined4 *puVar1;
  long lVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  size_t sVar5;
  pointer pTVar6;
  ulong uVar7;
  ulong position;
  long lVar8;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_f0;
  undefined1 local_d0 [8];
  wstring lowered;
  undefined1 local_90 [8];
  TWords candidates;
  TSentences sentences;
  undefined1 local_50 [8];
  TWords words;
  wstring *result;
  
  words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)__return_storage_ptr__;
  std::__cxx11::wstring::wstring((wstring *)local_d0,(wstring *)text);
  ToLower((wstring *)local_d0);
  TLangModel::Tokenize
            ((TSentences *)
             &candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,&this->LangModel,(wstring *)local_d0
            );
  (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage)->Ptr =
       (wchar_t *)
       (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage + 1);
  (words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
   super__Vector_impl_data._M_end_of_storage)->Len = 0;
  *(undefined4 *)
   &words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage[1].Ptr = 0;
  uVar7 = 0;
  __lhs = (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
          ((long)&lowered.field_2 + 8);
  while( true ) {
    pTVar6 = words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    if ((ulong)(((long)sentences.
                       super__Vector_base<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start -
                (long)candidates.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) / 0x18) <= uVar7) break;
    std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::vector
              ((vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_50,
               (vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)
               ((long)candidates.
                      super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage + uVar7 * 0x18));
    lVar8 = 0;
    position = 0;
    while( true ) {
      if ((ulong)((long)words.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_start - (long)local_50 >> 4) <= position)
      break;
      GetCandidatesRaw((TWords *)local_90,this,(TWords *)local_50,position);
      if ((undefined1  [8])
          candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl
          .super__Vector_impl_data._M_start != local_90) {
        uVar3 = *(undefined4 *)((long)(wchar_t **)local_90 + 4);
        sVar5 = *(size_t *)((long)local_90 + 8);
        uVar4 = *(undefined4 *)((long)((long)local_90 + 8) + 4);
        puVar1 = (undefined4 *)((long)(wchar_t **)local_50 + lVar8);
        *puVar1 = *(undefined4 *)(wchar_t **)local_90;
        puVar1[1] = uVar3;
        puVar1[2] = (int)sVar5;
        puVar1[3] = uVar4;
      }
      lVar2 = *(long *)((long)(wchar_t **)local_50 + lVar8);
      lowered.field_2._8_8_ = &stack0xffffffffffffff60;
      std::__cxx11::wstring::_M_construct<wchar_t_const*>
                ((wstring *)__lhs,lVar2,lVar2 + *(long *)((long)((long)local_50 + 8) + lVar8) * 4);
      std::operator+(&local_f0,__lhs,L" ");
      std::__cxx11::wstring::append
                ((wstring *)
                 words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::wstring::~wstring((wstring *)&local_f0);
      std::__cxx11::wstring::~wstring((wstring *)__lhs);
      std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
                ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_90);
      position = position + 1;
      lVar8 = lVar8 + 0x10;
    }
    if ((undefined1  [8])
        words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
        super__Vector_impl_data._M_start != local_50) {
      std::__cxx11::wstring::resize
                ((ulong)words.
                        super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::wstring::append
                ((wchar_t *)
                 words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    std::_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>::~_Vector_base
              ((_Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_> *)local_50);
    uVar7 = uVar7 + 1;
  }
  if ((words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage)->Len != 0) {
    std::__cxx11::wstring::resize
              ((ulong)words.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  std::
  vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
  ::~vector((vector<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>,_std::allocator<std::vector<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>_>_>
             *)&candidates.super__Vector_base<NJamSpell::TWord,_std::allocator<NJamSpell::TWord>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::wstring::~wstring((wstring *)local_d0);
  return (wstring *)pTVar6;
}

Assistant:

std::wstring TSpellCorrector::FixFragmentNormalized(const std::wstring& text) const {
    std::wstring lowered = text;
    ToLower(lowered);
    TSentences sentences = LangModel.Tokenize(lowered);
    std::wstring result;
    for (size_t i = 0; i < sentences.size(); ++i) {
        TWords words = sentences[i];
        for (size_t i = 0; i < words.size(); ++i) {
            TWords candidates = GetCandidatesRaw(words, i);
            if (candidates.size() > 0) {
                words[i] = candidates[0];
            }
            result += std::wstring(words[i].Ptr, words[i].Len) + L" ";
        }
        if (words.size() > 0) {
            result.resize(result.size() - 1);
            result += L". ";
        }
    }
    if (!result.empty()) {
        result.resize(result.size() - 1);
    }
    return result;
}